

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemWatcher_inotify.cpp
# Opt level: O0

void __thiscall FileSystemWatcher::notifyReadyRead(FileSystemWatcher *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ssize_t sVar4;
  int *key;
  byte local_1191;
  Log local_1188;
  undefined1 local_1178 [32];
  Log local_1158;
  undefined1 local_1148 [32];
  Log local_1128;
  undefined1 local_1118 [39];
  undefined1 local_10f1;
  undefined1 local_10f0 [7];
  bool isDir;
  String local_10d0;
  Flags<LogOutput::LogFlag> local_10b0;
  LogLevel local_10a4;
  undefined1 local_10a0 [8];
  Log log;
  Path path;
  inotify_event *event;
  int idx;
  int read;
  StackBuffer<4096UL,_char> buf;
  int s;
  lock_guard<std::mutex> lock;
  Log local_30;
  Log local_20;
  FileSystemWatcher *local_10;
  FileSystemWatcher *this_local;
  
  local_10 = this;
  if ((notifyReadyRead()::dumpFS == '\0') &&
     (iVar2 = __cxa_guard_acquire(&notifyReadyRead()::dumpFS), iVar2 != 0)) {
    pcVar3 = getenv("RTAGS_DUMP_INOTIFY");
    local_1191 = 0;
    if (pcVar3 != (char *)0x0) {
      pcVar3 = getenv("RTAGS_DUMP_INOTIFY");
      iVar2 = strcmp(pcVar3,"1");
      local_1191 = iVar2 != 0 ^ 0xff;
    }
    notifyReadyRead::dumpFS = (bool)(local_1191 & 1);
    __cxa_guard_release(&notifyReadyRead()::dumpFS);
  }
  if ((notifyReadyRead::dumpFS & 1U) != 0) {
    ::error();
    Log::operator<<(&local_20,(char *)&local_30);
    Log::~Log(&local_20);
    Log::~Log(&local_30);
  }
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&stack0xffffffffffffffb8,&this->mMutex);
  buf.mSize._4_4_ = 0;
  ioctl(this->mFd,0x541b,(undefined1 *)((long)&buf.mSize + 4));
  if (buf.mSize._4_4_ == 0) {
    buf.mSize._0_4_ = 1;
  }
  else {
    StackBuffer<4096UL,_char>::StackBuffer((StackBuffer<4096UL,_char> *)&idx,(long)buf.mSize._4_4_);
    iVar2 = this->mFd;
    pcVar3 = StackBuffer::operator_cast_to_char_((StackBuffer *)&idx);
    sVar4 = ::read(iVar2,pcVar3,(long)buf.mSize._4_4_);
    event._0_4_ = 0;
    while ((int)event < (int)sVar4) {
      pcVar3 = StackBuffer::operator_cast_to_char_((StackBuffer *)&idx);
      key = (int *)(pcVar3 + (int)event);
      event._0_4_ = key[3] + 0x10 + (int)event;
      Map<int,_Path,_std::less<int>_>::value
                ((Path *)&log.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,&this->mWatchedById,key);
      bVar1 = String::isEmpty((String *)
                              &log.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
      if (bVar1) {
        buf.mSize._0_4_ = 2;
      }
      else {
        if (((notifyReadyRead::dumpFS & 1U) != 0) && (key[1] != 0)) {
          local_10a4.mValue = LogLevel::Error.mValue;
          Flags<LogOutput::LogFlag>::Flags(&local_10b0,DefaultFlags);
          Log::Log((Log *)local_10a0,local_10a4,&local_10b0);
          Log::Log((Log *)&local_10d0,(Log *)local_10a0);
          operator+((String *)local_10f0,
                    (String *)
                    &log.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ,(char *)(key + 4));
          ::operator<<((Log *)&local_10d0.mString.field_2,&local_10d0);
          Log::~Log((Log *)&local_10d0.mString.field_2);
          String::~String((String *)local_10f0);
          Log::~Log((Log *)&local_10d0);
          dump((Log *)local_10a0,key[1]);
          Log::~Log((Log *)local_10a0);
        }
        local_10f1 = Path::isDir((Path *)&log.mData.
                                          super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                                          _M_refcount);
        if ((key[1] & 0x2c00U) == 0) {
          if ((key[1] & 0x180U) == 0) {
            if ((key[1] & 0x240U) == 0) {
              if ((key[1] & 0xcU) != 0) {
                if ((bool)local_10f1) {
                  String::append((String *)
                                 &log.mData.
                                  super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount,(char *)(key + 4),0xffffffffffffffff);
                }
                add(this,Modified,
                    (Path *)&log.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
              }
            }
            else {
              if ((bool)local_10f1) {
                String::append((String *)
                               &log.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount,(char *)(key + 4),0xffffffffffffffff);
              }
              add(this,Remove,
                  (Path *)&log.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
            }
          }
          else {
            if ((bool)local_10f1) {
              String::append((String *)
                             &log.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,(char *)(key + 4),0xffffffffffffffff);
            }
            add(this,Add,(Path *)&log.mData.
                                  super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount);
          }
        }
        else {
          add(this,Remove,
              (Path *)&log.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
        }
        buf.mSize._0_4_ = 0;
      }
      Path::~Path((Path *)&log.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
    }
    if ((notifyReadyRead::dumpFS & 1U) != 0) {
      bVar1 = Set<Path>::isEmpty(&this->mAddedPaths);
      if (!bVar1) {
        ::error();
        Log::operator<<((Log *)local_1118,(char *)&local_1128);
        ::operator<<((Log *)(local_1118 + 0x10),(Set<Path> *)local_1118);
        Log::~Log((Log *)(local_1118 + 0x10));
        Log::~Log((Log *)local_1118);
        Log::~Log(&local_1128);
      }
      bVar1 = Set<Path>::isEmpty(&this->mRemovedPaths);
      if (!bVar1) {
        ::error();
        Log::operator<<((Log *)local_1148,(char *)&local_1158);
        ::operator<<((Log *)(local_1148 + 0x10),(Set<Path> *)local_1148);
        Log::~Log((Log *)(local_1148 + 0x10));
        Log::~Log((Log *)local_1148);
        Log::~Log(&local_1158);
      }
      bVar1 = Set<Path>::isEmpty(&this->mModifiedPaths);
      if (!bVar1) {
        ::error();
        Log::operator<<((Log *)local_1178,(char *)&local_1188);
        ::operator<<((Log *)(local_1178 + 0x10),(Set<Path> *)local_1178);
        Log::~Log((Log *)(local_1178 + 0x10));
        Log::~Log((Log *)local_1178);
        Log::~Log(&local_1188);
      }
    }
    StackBuffer<4096UL,_char>::~StackBuffer((StackBuffer<4096UL,_char> *)&idx);
    buf.mSize._0_4_ = 0;
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xffffffffffffffb8);
  if ((int)buf.mSize == 0) {
    processChanges(this);
  }
  return;
}

Assistant:

void FileSystemWatcher::notifyReadyRead()
{
    static const bool dumpFS = getenv("RTAGS_DUMP_INOTIFY") && !strcmp(getenv("RTAGS_DUMP_INOTIFY"), "1");
    if (dumpFS) {
        error() << "FileSystemWatcher::notifyReadyRead";
    }
    {
        std::lock_guard<std::mutex> lock(mMutex);
        int s = 0;
        ioctl(mFd, FIONREAD, &s);
        if (!s)
            return;

        StackBuffer<4096> buf(s);
        const int read = ::read(mFd, buf, s);
        int idx = 0;
        while (idx < read) {
            inotify_event *event = reinterpret_cast<inotify_event*>(buf + idx);
            idx += sizeof(inotify_event) + event->len;
            Path path = mWatchedById.value(event->wd);
            if (path.isEmpty())
                continue;

            if (dumpFS && event->mask) {
                Log log(LogLevel::Error);
                log << (path + event->name);
                dump(log, event->mask);
            }

            const bool isDir = path.isDir();

            if (event->mask & (IN_DELETE_SELF|IN_MOVE_SELF|IN_UNMOUNT)) {
                add(Remove, path);
            } else if (event->mask & (IN_CREATE|IN_MOVED_TO)) {
                if (isDir)
                    path.append(event->name);
                add(Add, path);
            } else if (event->mask & (IN_DELETE|IN_MOVED_FROM)) {
                if (isDir)
                    path.append(event->name);
                add(Remove, path);
            } else if (event->mask & (IN_ATTRIB|IN_CLOSE_WRITE)) {
                if (isDir)
                    path.append(event->name);
                add(Modified, path);
            }
        }
        if (dumpFS) {
            if (!mAddedPaths.isEmpty())
                error() << "Added" << mAddedPaths;
            if (!mRemovedPaths.isEmpty())
                error() << "Removed" << mRemovedPaths;
            if (!mModifiedPaths.isEmpty())
                error() << "Modified" << mModifiedPaths;
        }
    }
    processChanges();
}